

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNtk.c
# Opt level: O2

void Wlc_ObjAddFanins(Wlc_Ntk_t *p,Wlc_Obj_t *pObj,Vec_Int_t *vFanins)

{
  ushort uVar1;
  int iVar2;
  uint uVar3;
  int *piVar4;
  
  if (pObj->nFanins != 0) {
    __assert_fail("pObj->nFanins == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlcNtk.c"
                  ,0xc4,"void Wlc_ObjAddFanins(Wlc_Ntk_t *, Wlc_Obj_t *, Vec_Int_t *)");
  }
  uVar3 = vFanins->nSize;
  pObj->nFanins = uVar3;
  iVar2 = Wlc_ObjHasArray(pObj);
  if (iVar2 != 0) {
    piVar4 = (int *)Mem_FlexEntryFetch(p->pMemFanin,uVar3 << 2);
    (pObj->field_9).pFanins[0] = piVar4;
    uVar3 = vFanins->nSize;
  }
  piVar4 = Wlc_ObjFanins(pObj);
  memcpy(piVar4,vFanins->pArray,(long)(int)uVar3 << 2);
  uVar1 = *(ushort *)pObj & 0x3f;
  if (uVar1 == 6) {
    uVar3 = 0;
  }
  else {
    if ((uVar1 != 0x35) && (uVar1 != 0x16)) {
      return;
    }
    uVar3 = 1;
  }
  pObj->nFanins = uVar3;
  return;
}

Assistant:

void Wlc_ObjAddFanins( Wlc_Ntk_t * p, Wlc_Obj_t * pObj, Vec_Int_t * vFanins )
{
    assert( pObj->nFanins == 0 );
    pObj->nFanins = Vec_IntSize(vFanins);
    if ( Wlc_ObjHasArray(pObj) )
        pObj->pFanins[0] = (int *)Mem_FlexEntryFetch( p->pMemFanin, Vec_IntSize(vFanins) * sizeof(int) );
    memcpy( Wlc_ObjFanins(pObj), Vec_IntArray(vFanins), sizeof(int) * Vec_IntSize(vFanins) );
    // special treatment of CONST, SELECT and TABLE
    if ( pObj->Type == WLC_OBJ_CONST )
        pObj->nFanins = 0;
    else if ( pObj->Type == WLC_OBJ_BIT_SELECT || pObj->Type == WLC_OBJ_TABLE )
        pObj->nFanins = 1;
}